

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O2

void uWS::WebSocketProtocol<true,_uWS::WebSocketContext<true,_true>_>::consume
               (char *src,uint length,WebSocketState<true> *wState,void *user)

{
  bool bVar1;
  unsigned_long payLength;
  byte bVar2;
  uint uVar3;
  uint length_local;
  char *src_local;
  
  bVar2 = *(byte *)&wState->state;
  uVar3 = bVar2 >> 1 & 0xf;
  length_local = length;
  src_local = src;
  if ((bVar2 >> 1 & 0xf) != 0) {
    src_local = src + -(ulong)uVar3;
    length_local = uVar3 + length;
    memcpy(src_local,(wState->state).spill,(ulong)uVar3);
    bVar2 = *(byte *)&wState->state;
  }
  if (((bVar2 & 1) != 0) ||
     (bVar1 = consumeContinuation(&src_local,&length_local,wState,user), bVar1)) {
    do {
      if (length_local < 6) goto LAB_00174a24;
      bVar2 = *src_local;
      if ((bVar2 & 0x40) != 0) {
        bVar1 = WebSocketContext<true,_true>::setCompressed(wState,user);
        if (!bVar1) goto LAB_00174a17;
        bVar2 = *src_local;
      }
      if ((bVar2 & 0x30) != 0) {
LAB_00174a17:
        us_socket_close(1,user);
        return;
      }
      if ((bVar2 & 0xf) < 3) {
        bVar2 = src_local[1];
      }
      else if (((-1 < (char)bVar2) || (2 < (byte)((bVar2 & 0xf) - 8))) ||
              (bVar2 = src_local[1], (~bVar2 & 0x7e) == 0)) goto LAB_00174a17;
      bVar2 = bVar2 & 0x7f;
      if (bVar2 < 0x7e) {
        bVar1 = WebSocketProtocol<true,uWS::WebSocketContext<true,true>>::
                consumeMessage<6u,unsigned_char>(bVar2,&src_local,&length_local,wState,user);
      }
      else if (bVar2 == 0x7e) {
        if (length_local < 8) {
LAB_00174a24:
          uVar3 = length_local;
          if (length_local == 0) {
            return;
          }
          memcpy((wState->state).spill,src_local,(ulong)length_local);
          *(byte *)&wState->state = *(byte *)&wState->state & 0xe1 | (char)uVar3 * '\x02';
          return;
        }
        bVar1 = WebSocketProtocol<true,uWS::WebSocketContext<true,true>>::
                consumeMessage<8u,unsigned_short>
                          (*(ushort *)(src_local + 2) << 8 | *(ushort *)(src_local + 2) >> 8,
                           &src_local,&length_local,wState,user);
      }
      else {
        if (length_local < 0xe) goto LAB_00174a24;
        payLength = protocol::cond_byte_swap<unsigned_long>(*(unsigned_long *)(src_local + 2));
        bVar1 = WebSocketProtocol<true,uWS::WebSocketContext<true,true>>::
                consumeMessage<14u,unsigned_long>(payLength,&src_local,&length_local,wState,user);
      }
    } while (bVar1 == false);
  }
  return;
}

Assistant:

static inline void consume(char *src, unsigned int length, WebSocketState<isServer> *wState, void *user) {
        if (wState->state.spillLength) {
            src -= wState->state.spillLength;
            length += wState->state.spillLength;
            memcpy(src, wState->state.spill, wState->state.spillLength);
        }
        if (wState->state.wantsHead) {
            parseNext:
            while (length >= SHORT_MESSAGE_HEADER) {

                // invalid reserved bits / invalid opcodes / invalid control frames / set compressed frame
                if ((rsv1(src) && !Impl::setCompressed(wState, user)) || rsv23(src) || (getOpCode(src) > 2 && getOpCode(src) < 8) ||
                    getOpCode(src) > 10 || (getOpCode(src) > 2 && (!isFin(src) || payloadLength(src) > 125))) {
                    Impl::forceClose(wState, user);
                    return;
                }

                if (payloadLength(src) < 126) {
                    if (consumeMessage<SHORT_MESSAGE_HEADER, uint8_t>(payloadLength(src), src, length, wState, user)) {
                        return;
                    }
                } else if (payloadLength(src) == 126) {
                    if (length < MEDIUM_MESSAGE_HEADER) {
                        break;
                    } else if(consumeMessage<MEDIUM_MESSAGE_HEADER, uint16_t>(protocol::cond_byte_swap<uint16_t>(protocol::bit_cast<uint16_t>(src + 2)), src, length, wState, user)) {
                        return;
                    }
                } else if (length < LONG_MESSAGE_HEADER) {
                    break;
                } else if (consumeMessage<LONG_MESSAGE_HEADER, uint64_t>(protocol::cond_byte_swap<uint64_t>(protocol::bit_cast<uint64_t>(src + 2)), src, length, wState, user)) {
                    return;
                }
            }
            if (length) {
                memcpy(wState->state.spill, src, length);
                wState->state.spillLength = length & 0xf;
            }
        } else if (consumeContinuation(src, length, wState, user)) {
            goto parseNext;
        }
    }